

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O3

int VP8EncAnalyze(VP8Encoder *enc)

{
  VP8MBInfo *pVVar1;
  uint uVar2;
  size_t __n;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  WebPWorkerInterface *pWVar9;
  long lVar10;
  void *ptr;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  VP8Encoder *pVVar25;
  int *piVar26;
  int w;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int centers [4];
  int accum [4];
  SegmentJob side_job;
  undefined8 local_2740;
  int local_2738 [4];
  undefined1 local_2728 [16];
  ulong local_2710;
  VP8Encoder *local_2708;
  ulong local_2700;
  ulong local_26f8;
  size_t local_26f0;
  int local_26e8 [4];
  int local_26d8 [6];
  SegmentJob local_26c0;
  SegmentJob local_1378;
  
  if (((enc->config->emulate_jpeg_size == 0) && ((enc->segment_hdr).num_segments < 2)) &&
     (1 < enc->method)) {
    if (0 < enc->mb_h * enc->mb_w) {
      lVar10 = 0;
      do {
        pVVar1 = enc->mb_info;
        *(byte *)(pVVar1 + lVar10) = (*(byte *)(pVVar1 + lVar10) & 0x80) + 1;
        pVVar1[lVar10].alpha = '\0';
        lVar10 = lVar10 + 1;
      } while (lVar10 < (long)enc->mb_h * (long)enc->mb_w);
    }
    enc->dqm[0].alpha = 0;
    enc->dqm[0].beta = 0;
    enc->alpha = 0;
    enc->uv_alpha = 0;
    WebPReportProgress(enc->pic,enc->percent + 0x14,&enc->percent);
    return 1;
  }
  iVar5 = enc->mb_h;
  iVar13 = enc->mb_w * iVar5;
  iVar23 = enc->thread_level;
  pWVar9 = WebPGetWorkerInterface();
  local_2708 = enc;
  if ((iVar23 < 1) || (iVar23 = iVar5 * 9 + 0xf >> 4, iVar23 < 2)) {
    InitSegmentJob(enc,&local_26c0,0,iVar5);
    (*pWVar9->Execute)(&local_26c0.worker);
    uVar8 = (*pWVar9->Sync)(&local_26c0.worker);
    uVar8 = uVar8 & 1;
  }
  else {
    InitSegmentJob(enc,&local_26c0,0,iVar23);
    InitSegmentJob(enc,&local_1378,iVar23,iVar5);
    uVar3 = (*pWVar9->Reset)(&local_1378.worker);
    uVar8 = 0;
    if ((uVar3 & 1) == 0) {
      (*pWVar9->End)(&local_1378.worker);
      enc = local_2708;
    }
    else {
      (*pWVar9->Launch)(&local_1378.worker);
      (*pWVar9->Execute)(&local_26c0.worker);
      uVar3 = (*pWVar9->Sync)(&local_1378.worker);
      uVar4 = (*pWVar9->Sync)(&local_26c0.worker);
      (*pWVar9->End)(&local_1378.worker);
      uVar3 = uVar4 & uVar3 & 1;
      enc = local_2708;
      if (uVar3 != 0) {
        lVar10 = 0;
        do {
          iVar5 = local_1378.alphas[lVar10 + 1];
          iVar23 = local_1378.alphas[lVar10 + 2];
          iVar16 = local_1378.alphas[lVar10 + 3];
          iVar21 = local_26c0.alphas[lVar10 + 1];
          iVar6 = local_26c0.alphas[lVar10 + 2];
          iVar7 = local_26c0.alphas[lVar10 + 3];
          local_26c0.alphas[lVar10] = local_26c0.alphas[lVar10] + local_1378.alphas[lVar10];
          local_26c0.alphas[lVar10 + 1] = iVar21 + iVar5;
          local_26c0.alphas[lVar10 + 2] = iVar6 + iVar23;
          local_26c0.alphas[lVar10 + 3] = iVar7 + iVar16;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0x100);
        iVar5 = local_26c0.uv_alpha;
        local_26c0.alpha = local_26c0.alpha + local_1378.alpha;
        local_26c0.uv_alpha = iVar5 + local_1378.uv_alpha;
        uVar8 = uVar3;
      }
    }
  }
  (*pWVar9->End)(&local_26c0.worker);
  if (uVar8 == 0) {
    iVar5 = WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar5;
  }
  enc->alpha = local_26c0.alpha / iVar13;
  enc->uv_alpha = local_26c0.uv_alpha / iVar13;
  uVar3 = (enc->segment_hdr).num_segments;
  uVar4 = 4;
  if ((int)uVar3 < 4) {
    uVar4 = uVar3;
  }
  uVar24 = 0;
  do {
    if (local_26c0.alphas[uVar24] != 0) {
      if (0xfe < uVar24) {
        uVar14 = 0xff;
        goto LAB_0016315b;
      }
      uVar14 = 0xff;
      goto LAB_0016313f;
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x100);
  uVar14 = 0xff;
  uVar24 = 0x100;
  goto LAB_0016315b;
  while (uVar14 = uVar14 - 1, uVar24 < uVar14) {
LAB_0016313f:
    if (local_26c0.alphas[uVar14] != 0) goto LAB_0016315b;
  }
  uVar14 = uVar24 & 0xffffffff;
LAB_0016315b:
  iVar23 = (int)uVar14;
  iVar5 = (int)uVar24;
  if (0 < (int)uVar3) {
    iVar13 = iVar23 - iVar5;
    lVar10 = (ulong)uVar4 - 1;
    auVar27._8_4_ = (int)lVar10;
    auVar27._0_8_ = lVar10;
    auVar27._12_4_ = (int)((ulong)lVar10 >> 0x20);
    iVar16 = iVar23 * 3 + iVar5 * -3;
    iVar21 = iVar23 * 4 + iVar5 * -4;
    uVar22 = 0;
    auVar27 = auVar27 ^ _DAT_00189bf0;
    auVar28 = _DAT_00189a00;
    do {
      auVar29 = auVar28 ^ _DAT_00189bf0;
      if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                  auVar27._4_4_ < auVar29._4_4_) & 1)) {
        *(int *)((long)local_2738 + uVar22) = iVar13 / (int)(uVar4 * 2) + iVar5;
      }
      if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
          auVar29._12_4_ <= auVar27._12_4_) {
        *(int *)((long)local_2738 + uVar22 + 4) = iVar16 / (int)(uVar4 * 2) + iVar5;
      }
      lVar10 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar10 + 2;
      uVar22 = uVar22 + 8;
      iVar16 = iVar16 + iVar21;
      iVar13 = iVar13 + iVar21;
    } while ((uVar4 * 4 + 4 & 0x38) != uVar22);
  }
  local_26f0 = (ulong)(uVar4 - 1) * 4 + 4;
  local_26f8 = uVar24 & 0xffffffff;
  local_2710 = uVar24;
  local_2700 = uVar14;
  if (iVar5 < iVar23) {
    iVar5 = iVar23;
  }
  iVar23 = 0;
  do {
    __n = local_26f0;
    if (0 < (int)uVar3) {
      local_2740 = CONCAT44(local_2740._4_4_,iVar23);
      memset(local_26d8,0,local_26f0);
      iVar23 = (int)local_2740;
      memset(local_26e8,0,__n);
      uVar8 = uVar3;
    }
    if ((int)local_2710 <= (int)local_2700) {
      iVar13 = 0;
      uVar24 = local_26f8;
      do {
        iVar16 = local_26c0.alphas[uVar24];
        if (iVar16 != 0) {
          uVar18 = iVar13 + 1U;
          if ((int)(iVar13 + 1U) < (int)uVar4) {
            uVar18 = uVar4;
          }
          iVar21 = iVar13 + -1;
          lVar10 = (long)iVar13;
          do {
            lVar17 = lVar10 + 1;
            iVar6 = (int)uVar24;
            iVar13 = uVar18 - 1;
            if ((int)uVar4 <= lVar17) break;
            uVar19 = iVar6 - local_2738[lVar10 + 1];
            uVar2 = -uVar19;
            if (0 < (int)uVar19) {
              uVar2 = uVar19;
            }
            uVar20 = iVar6 - *(int *)((long)&local_2740 + lVar17 * 4 + 4);
            uVar19 = -uVar20;
            if (0 < (int)uVar20) {
              uVar19 = uVar20;
            }
            iVar21 = iVar21 + 1;
            lVar10 = lVar17;
            iVar13 = iVar21;
          } while (uVar2 < uVar19);
          local_26e8[iVar13] = local_26e8[iVar13] + iVar16 * iVar6;
          local_1378.alphas[uVar24 - 0xc] = iVar13;
          local_26d8[iVar13] = local_26d8[iVar13] + iVar16;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != iVar5 + 1);
    }
    if ((int)uVar3 < 1) goto LAB_0016339e;
    uVar14 = 0;
    iVar13 = 0;
    iVar16 = 0;
    uVar24 = 0;
    do {
      iVar21 = local_26d8[uVar14];
      if (iVar21 != 0) {
        iVar7 = (iVar21 / 2 + local_26e8[uVar14]) / iVar21;
        iVar11 = local_2738[uVar14] - iVar7;
        iVar6 = -iVar11;
        if (0 < iVar11) {
          iVar6 = iVar11;
        }
        iVar16 = iVar16 + iVar6;
        local_2738[uVar14] = iVar7;
        iVar13 = iVar13 + iVar7 * iVar21;
        uVar24 = (ulong)(uint)((int)uVar24 + iVar21);
      }
      uVar14 = uVar14 + 1;
    } while (uVar4 != uVar14);
  } while ((4 < iVar16) && (iVar23 = iVar23 + 1, iVar23 != 6));
  uVar8 = (iVar13 + ((int)(uVar24 >> 0x1f) + (int)uVar24 >> 1)) / (int)uVar24;
LAB_0016339e:
  pVVar25 = local_2708;
  uVar4 = local_2708->mb_w;
  iVar5 = local_2708->mb_h;
  iVar23 = iVar5 * uVar4;
  if (0 < iVar23) {
    lVar10 = 0;
    do {
      pVVar1 = local_2708->mb_info;
      iVar5 = local_1378.alphas[(ulong)pVVar1[lVar10].alpha - 0xc];
      *(byte *)(pVVar1 + lVar10) = *(byte *)(pVVar1 + lVar10) & 0x9f | ((byte)iVar5 & 3) << 5;
      pVVar1[lVar10].alpha = (uint8_t)local_2738[iVar5];
      lVar10 = lVar10 + 1;
      uVar4 = local_2708->mb_w;
      iVar5 = local_2708->mb_h;
      iVar23 = iVar5 * uVar4;
    } while (lVar10 < iVar23);
  }
  if (((1 < (int)uVar3) && ((local_2708->config->preprocessing & 1) != 0)) &&
     (ptr = WebPSafeMalloc((long)iVar23,1), ptr != (void *)0x0)) {
    if (2 < iVar5) {
      local_2700 = CONCAT44(local_2700._4_4_,uVar8);
      uVar3 = uVar4 - 1;
      local_2710 = (ulong)uVar4;
      local_2740 = 1;
      do {
        if (2 < (int)uVar4) {
          lVar10 = local_2740 * local_2710;
          uVar24 = 1;
          do {
            local_2728 = (undefined1  [16])0x0;
            lVar17 = uVar24 + lVar10;
            pVVar1 = pVVar25->mb_info + lVar17;
            bVar15 = *(byte *)pVVar1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)~uVar4) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)~uVar4) >> 3 & 0xc)) + 1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)-uVar4) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)-uVar4) >> 3 & 0xc)) + 1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)(1 - uVar4)) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)(1 - uVar4)) >> 3 & 0xc)) + 1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) + 1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) + 1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)uVar3) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)uVar3) >> 3 & 0xc)) + 1;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) + 1;
            bVar15 = bVar15 >> 5 & 3;
            *(int *)(local_2728 + (*(byte *)(pVVar1 + (long)(int)uVar4 + 1) >> 3 & 0xc)) =
                 *(int *)(local_2728 + (*(byte *)(pVVar1 + (long)(int)uVar4 + 1) >> 3 & 0xc)) + 1;
            lVar12 = 0;
            do {
              if (4 < *(int *)(local_2728 + lVar12 * 4)) {
                bVar15 = (byte)lVar12;
                break;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != 4);
            *(byte *)((long)ptr + lVar17) = bVar15;
            uVar24 = uVar24 + 1;
            pVVar25 = local_2708;
          } while (uVar24 != uVar3);
        }
        local_2740 = local_2740 + 1;
      } while (local_2740 != iVar5 - 1);
      lVar10 = local_2710 + 1;
      uVar24 = 1;
      do {
        lVar17 = lVar10;
        lVar12 = (ulong)uVar3 - 1;
        if (2 < (int)uVar4) {
          do {
            *(byte *)(pVVar25->mb_info + lVar17) =
                 *(byte *)(pVVar25->mb_info + lVar17) & 0x9f |
                 (*(byte *)((long)ptr + lVar17) & 3) << 5;
            lVar12 = lVar12 + -1;
            lVar17 = lVar17 + 1;
          } while (lVar12 != 0);
        }
        uVar24 = uVar24 + 1;
        lVar10 = lVar10 + local_2710;
        uVar8 = (uint)local_2700;
      } while (uVar24 != iVar5 - 1);
    }
    WebPSafeFree(ptr);
  }
  iVar5 = (pVVar25->segment_hdr).num_segments;
  lVar10 = (long)iVar5;
  iVar23 = local_2738[0];
  if (1 < lVar10) {
    lVar17 = 0;
    do {
      iVar13 = local_2738[lVar17];
      if (iVar13 <= local_2738[0]) {
        local_2738[0] = iVar13;
      }
      if (iVar23 <= iVar13) {
        iVar23 = iVar13;
      }
      lVar17 = lVar17 + 1;
    } while (lVar10 != lVar17);
  }
  if (0 < iVar5) {
    iVar5 = local_2738[0] + 1;
    if (iVar23 != local_2738[0]) {
      iVar5 = iVar23;
    }
    piVar26 = &pVVar25->dqm[0].beta;
    lVar17 = 0;
    do {
      iVar23 = (int)((local_2738[lVar17] - uVar8) * 0xff) / (iVar5 - local_2738[0]);
      iVar13 = ((local_2738[lVar17] - local_2738[0]) * 0xff) / (iVar5 - local_2738[0]);
      if (0x7e < iVar23) {
        iVar23 = 0x7f;
      }
      if (iVar23 < -0x7e) {
        iVar23 = -0x7f;
      }
      piVar26[-1] = iVar23;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      *piVar26 = iVar13;
      lVar17 = lVar17 + 1;
      piVar26 = piVar26 + 0xba;
    } while (lVar10 != lVar17);
  }
  return 1;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr.num_segments > 1) ||
      (enc->method <= 1);  // for method 0 - 1, we need preds[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h;
    const int total_mb = last_row * enc->mb_w;
#ifdef WEBP_USE_THREAD
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
#ifdef WEBP_USE_THREAD
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
#endif  // WEBP_USE_THREAD
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha = main_job.alpha / total_mb;
      enc->uv_alpha = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  if (!ok) {
    return WebPEncodingSetError(enc->pic,
                                VP8_ENC_ERROR_OUT_OF_MEMORY);  // imprecise
  }
  return ok;
}